

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldName
          (Printer *this,Message *message,int field_index,int field_count,Reflection *reflection,
          FieldDescriptor *field,TextGenerator *generator)

{
  char *pcVar1;
  FastFieldValuePrinter *pFVar2;
  char local_70 [32];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (this->use_field_number_ == true) {
    pcVar1 = FastInt32ToBufferLeft(*(int32 *)(field + 0x44),local_70);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_70,pcVar1);
    (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    return;
  }
  pFVar2 = GetFieldPrinter(this,field);
  (*pFVar2->_vptr_FastFieldValuePrinter[0xc])
            (pFVar2,message,(ulong)(uint)field_index,(ulong)(uint)field_count,reflection,field);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldName(const Message& message,
                                         int field_index, int field_count,
                                         const Reflection* reflection,
                                         const FieldDescriptor* field,
                                         TextGenerator* generator) const {
  // if use_field_number_ is true, prints field number instead
  // of field name.
  if (use_field_number_) {
    generator->PrintString(StrCat(field->number()));
    return;
  }

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);
  printer->PrintFieldName(message, field_index, field_count, reflection, field,
                          generator);
}